

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  size_t sVar1;
  ptls_context_t *ppVar2;
  ptls_key_exchange_context_t *ppVar3;
  ptls_buffer_t *sendbuf;
  char *sni_name_00;
  uint8_t *puVar4;
  ptls_iovec_t psk_secret;
  ptls_iovec_t psk_secret_00;
  ptls_iovec_t psk_secret_01;
  ptls_iovec_t psk_identity;
  ptls_iovec_t psk_identity_00;
  ptls_iovec_t psk_identity_01;
  uint uVar5;
  int iVar6;
  ptls_key_schedule_t *ppVar7;
  size_t sVar8;
  size_t __size;
  uint8_t *puVar9;
  size_t sVar10;
  en_ptls_state_t eVar11;
  ptls_iovec_t pVar12;
  uint8_t *local_1f8;
  size_t len;
  size_t local_1b8;
  size_t ech_size_offset;
  size_t ech_payload_size;
  size_t final_len;
  size_t padding_len;
  long local_188;
  size_t psk_binder_off;
  uint8_t *local_178;
  uint local_16c;
  ptls_cipher_suite_t *ppStack_168;
  uint32_t max_early_data_size;
  ptls_cipher_suite_t *cipher_suite;
  ptls_key_exchange_algorithm_t *key_share;
  size_t i;
  st_decoded_ech_config_t decoded;
  int is_second_flight;
  int ret;
  ptls_buffer_t encoded_ch_inner;
  uint8_t binder_key [64];
  size_t msghash_off;
  size_t mess_start;
  char *sni_name;
  undefined1 auStack_78 [4];
  uint32_t obfuscated_ticket_age;
  anon_struct_40_3_baba9703 psk;
  ptls_iovec_t *cookie_local;
  ptls_handshake_properties_t *properties_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  
  psk.label = (char *)cookie;
  memset(auStack_78,0,0x28);
  sni_name._4_4_ = 0;
  mess_start = 0;
  decoded.bytes.len._0_4_ = (uint)(tls->key_schedule != (ptls_key_schedule_t *)0x0);
  ptls_buffer_init((ptls_buffer_t *)&is_second_flight,"",0);
  if ((tls->server_name != (char *)0x0) &&
     (iVar6 = ptls_server_name_is_ipaddr(tls->server_name), iVar6 == 0)) {
    mess_start = (size_t)tls->server_name;
  }
  if ((((properties != (ptls_handshake_properties_t *)0x0) && ((uint)decoded.bytes.len == 0)) &&
      (mess_start != 0)) && ((tls->ctx->ech).client.ciphers != (ptls_hpke_cipher_suite_t **)0x0)) {
    if ((properties->field_0).client.ech.configs.len == 0) {
      client_setup_ech_grease
                (&tls->ech,tls->ctx->random_bytes,(tls->ctx->ech).client.kems,
                 (tls->ctx->ech).client.ciphers,(char *)mess_start);
    }
    else {
      client_decode_ech_config_list
                (tls->ctx,(st_decoded_ech_config_t *)&i,(properties->field_0).client.ech.configs);
      if ((decoded._0_8_ != 0) && (decoded.public_key.len != 0)) {
        decoded.bytes.len._4_4_ =
             client_setup_ech(&tls->ech,(st_decoded_ech_config_t *)&i,tls->ctx->random_bytes);
        if (decoded.bytes.len._4_4_ != 0) goto LAB_001255e3;
        decoded.bytes.len._4_4_ = 0;
      }
    }
  }
  if ((tls->ctx->pre_shared_key).identity.base != (uint8_t *)0x0) {
    if ((uint)decoded.bytes.len == 0) {
      (tls->field_19).server.pending_traffic_secret[0x38] =
           (tls->field_19).server.pending_traffic_secret[0x38] & 0xfe | 1;
      for (key_share = (ptls_key_exchange_algorithm_t *)0x0;
          tls->ctx->cipher_suites[(long)key_share] != (ptls_cipher_suite_t *)0x0;
          key_share = (ptls_key_exchange_algorithm_t *)((long)&key_share->id + 1)) {
        if (tls->ctx->cipher_suites[(long)key_share]->hash == (tls->ctx->pre_shared_key).hash) {
          tls->cipher_suite = tls->ctx->cipher_suites[(long)key_share];
          break;
        }
      }
      if (tls->cipher_suite == (ptls_cipher_suite_t *)0x0) {
        __assert_fail("tls->cipher_suite != NULL && \"no compatible cipher-suite provided that matches psk.hash\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0x954,
                      "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                     );
      }
      if ((properties != (ptls_handshake_properties_t *)0x0) &&
         ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
        (tls->field_19).server.pending_traffic_secret[0x38] =
             (tls->field_19).server.pending_traffic_secret[0x38] & 0xfd | 2;
        *(properties->field_0).client.max_early_data_size = 0xffffffffffffffff;
      }
    }
    else if ((tls->cipher_suite == (ptls_cipher_suite_t *)0x0) ||
            (tls->cipher_suite->hash != (tls->ctx->pre_shared_key).hash)) {
      __assert_fail("tls->cipher_suite != NULL && tls->cipher_suite->hash == tls->ctx->pre_shared_key.hash"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x95a,
                    "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                   );
    }
    _auStack_78 = (tls->ctx->pre_shared_key).secret.base;
    psk.secret.base = (uint8_t *)(tls->ctx->pre_shared_key).secret.len;
    psk.secret.len = (size_t)(tls->ctx->pre_shared_key).identity.base;
    psk.identity.base = (uint8_t *)(tls->ctx->pre_shared_key).identity.len;
    psk.identity.len = (size_t)anon_var_dwarf_f0b7;
  }
  if ((((_auStack_78 == (uint8_t *)0x0) && (properties != (ptls_handshake_properties_t *)0x0)) &&
      ((properties->field_0).client.session_ticket.base != (uint8_t *)0x0)) &&
     (tls->ctx->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0)) {
    cipher_suite = (ptls_cipher_suite_t *)0x0;
    ppStack_168 = (ptls_cipher_suite_t *)0x0;
    iVar6 = decode_stored_session_ticket
                      (tls,(ptls_key_exchange_algorithm_t **)&cipher_suite,&stack0xfffffffffffffe98,
                       (ptls_iovec_t *)auStack_78,(uint32_t *)((long)&sni_name + 4),
                       (ptls_iovec_t *)&psk.secret.len,&local_16c,
                       (properties->field_0).client.session_ticket.base,
                       (properties->field_0).client.session_ticket.base +
                       (properties->field_0).client.session_ticket.len);
    if (iVar6 == 0) {
      psk.identity.len = (size_t)anon_var_dwarf_f0c3;
      (tls->field_19).server.pending_traffic_secret[0x38] =
           (tls->field_19).server.pending_traffic_secret[0x38] & 0xfe | 1;
      if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
        tls->key_share = (ptls_key_exchange_algorithm_t *)cipher_suite;
      }
      tls->cipher_suite = ppStack_168;
      if ((((uint)decoded.bytes.len == 0) && (local_16c != 0)) &&
         ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
        (tls->field_19).server.pending_traffic_secret[0x38] =
             (tls->field_19).server.pending_traffic_secret[0x38] & 0xfd | 2;
        *(properties->field_0).client.max_early_data_size = (ulong)local_16c;
      }
    }
    else {
      _psk_binder_off = ptls_iovec_init((void *)0x0,0);
      _auStack_78 = (uint8_t *)psk_binder_off;
      psk.secret.base = local_178;
    }
  }
  if (properties != (ptls_handshake_properties_t *)0x0) {
    if (((tls->field_19).server.pending_traffic_secret[0x38] >> 1 & 1) == 0) {
      if ((properties->field_0).client.max_early_data_size != (size_t *)0x0) {
        *(properties->field_0).client.max_early_data_size = 0;
      }
      (properties->field_0).client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
    }
    else {
      (properties->field_0).client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
    }
  }
  if (((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) &&
      (tls->ctx->key_exchanges != (ptls_key_exchange_algorithm_t **)0x0)) &&
     ((properties == (ptls_handshake_properties_t *)0x0 ||
      (((properties->field_0).server.selected_psk_binder.base[0x2c] & 1) == 0)))) {
    tls->key_share = *tls->ctx->key_exchanges;
  }
  if ((tls->field_19).client.key_share_ctx != (ptls_key_exchange_context_t *)0x0) {
    __assert_fail("tls->client.key_share_ctx == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x98a,
                  "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                 );
  }
  if (tls->key_share != (ptls_key_exchange_algorithm_t *)0x0) {
    decoded.bytes.len._4_4_ =
         (*tls->key_share->create)(tls->key_share,&(tls->field_19).client.key_share_ctx);
    if (decoded.bytes.len._4_4_ != 0) goto LAB_001255e3;
    decoded.bytes.len._4_4_ = 0;
  }
  if ((uint)decoded.bytes.len == 0) {
    ppVar7 = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                              (uint)((tls->ech).aead != (ptls_aead_context_t *)0x0));
    tls->key_schedule = ppVar7;
    if (ppVar7 == (ptls_key_schedule_t *)0x0) {
      decoded.bytes.len._4_4_ = 0x201;
      goto LAB_001255e3;
    }
    pVar12.len = (size_t)psk.secret.base;
    pVar12.base = _auStack_78;
    decoded.bytes.len._4_4_ = key_schedule_extract(tls->key_schedule,pVar12);
    if (decoded.bytes.len._4_4_ != 0) goto LAB_001255e3;
    decoded.bytes.len._4_4_ = 0;
  }
  decoded.bytes.len._4_4_ = (*emitter->begin_message)(emitter);
  if (decoded.bytes.len._4_4_ == 0) {
    sVar1 = emitter->buf->off;
    if ((tls->ech).aead == (ptls_aead_context_t *)0x0) {
      local_1f8 = tls->client_random;
    }
    else {
      local_1f8 = (tls->ech).inner_client_random;
    }
    psk_secret.len = (size_t)psk.secret.base;
    psk_secret.base = _auStack_78;
    psk_identity.len = (size_t)psk.identity.base;
    psk_identity.base = (uint8_t *)psk.secret.len;
    decoded.bytes.len._4_4_ =
         encode_client_hello(tls->ctx,emitter->buf,ENCODE_CH_MODE_INNER,(uint)decoded.bytes.len,
                             properties,local_1f8,(tls->field_19).client.key_share_ctx,
                             (char *)mess_start,(tls->field_19).client.legacy_session_id,&tls->ech,
                             (size_t *)0x0,(tls->ech).client.first_ech,psk_secret,psk_identity,
                             sni_name._4_4_,(tls->key_schedule->hashes[0].algo)->digest_size,
                             (ptls_iovec_t *)psk.label,
                             (uint)((tls->field_19).server.pending_traffic_secret[0x38] >> 1 & 1));
    if (decoded.bytes.len._4_4_ == 0) {
      binder_key._56_8_ = sVar1;
      if (_auStack_78 != (uint8_t *)0x0) {
        local_188 = emitter->buf->off - ((tls->key_schedule->hashes[0].algo)->digest_size + 3);
        decoded.bytes.len._4_4_ =
             derive_secret_with_empty_digest
                       (tls->key_schedule,&encoded_ch_inner.is_allocated,(char *)psk.identity.len);
        if (decoded.bytes.len._4_4_ != 0) goto LAB_001255e3;
        ptls__key_schedule_update_hash
                  (tls->key_schedule,emitter->buf->base + sVar1,local_188 - sVar1,0);
        binder_key[0x38] = (undefined1)local_188;
        binder_key[0x39] = local_188._1_1_;
        binder_key[0x3a] = local_188._2_1_;
        binder_key[0x3b] = local_188._3_1_;
        binder_key[0x3c] = local_188._4_1_;
        binder_key[0x3d] = local_188._5_1_;
        binder_key[0x3e] = local_188._6_1_;
        binder_key[0x3f] = local_188._7_1_;
        decoded.bytes.len._4_4_ =
             calc_verify_data(emitter->buf->base + local_188 + 3,tls->key_schedule,
                              &encoded_ch_inner.is_allocated);
        if (decoded.bytes.len._4_4_ != 0) goto LAB_001255e3;
      }
      decoded.bytes.len._4_4_ = 0;
      ptls__key_schedule_update_hash
                (tls->key_schedule,emitter->buf->base + binder_key._56_8_,
                 emitter->buf->off - binder_key._56_8_,0);
      uVar5 = (uint)decoded.bytes.len;
      if ((tls->ech).aead != (ptls_aead_context_t *)0x0) {
        ppVar2 = tls->ctx;
        ppVar3 = (tls->field_19).client.key_share_ctx;
        _padding_len = ptls_iovec_init((void *)0x0,0);
        psk_secret_00.len = (size_t)psk.secret.base;
        psk_secret_00.base = _auStack_78;
        psk_identity_00.len = (size_t)psk.identity.base;
        psk_identity_00.base = (uint8_t *)psk.secret.len;
        decoded.bytes.len._4_4_ =
             encode_client_hello(ppVar2,(ptls_buffer_t *)&is_second_flight,
                                 ENCODE_CH_MODE_ENCODED_INNER,uVar5,properties,
                                 (tls->ech).inner_client_random,ppVar3,(char *)mess_start,
                                 (tls->field_19).client.legacy_session_id,&tls->ech,(size_t *)0x0,
                                 _padding_len,psk_secret_00,psk_identity_00,sni_name._4_4_,
                                 (tls->key_schedule->hashes[0].algo)->digest_size,
                                 (ptls_iovec_t *)psk.label,
                                 (uint)((tls->field_19).server.pending_traffic_secret[0x38] >> 1 & 1
                                       ));
        if (decoded.bytes.len._4_4_ != 0) goto LAB_001255e3;
        if (_auStack_78 != (uint8_t *)0x0) {
          memcpy(_is_second_flight +
                 (encoded_ch_inner.capacity - (tls->key_schedule->hashes[0].algo)->digest_size),
                 emitter->buf->base +
                 (emitter->buf->off - (tls->key_schedule->hashes[0].algo)->digest_size),
                 (tls->key_schedule->hashes[0].algo)->digest_size);
        }
        if (mess_start == 0) {
          final_len = (size_t)(int)((tls->ech).client.max_name_length + 9);
        }
        else {
          final_len = strlen((char *)mess_start);
          if (final_len < (tls->ech).client.max_name_length) {
            final_len = (size_t)(tls->ech).client.max_name_length;
          }
        }
        ech_payload_size = encoded_ch_inner.capacity + final_len + 0x1b & 0xffffffffffffffe0;
        final_len = ech_payload_size - (encoded_ch_inner.capacity - 4);
        if (final_len != 0) {
          decoded.bytes.len._4_4_ =
               ptls_buffer_reserve((ptls_buffer_t *)&is_second_flight,final_len);
          if (decoded.bytes.len._4_4_ != 0) goto LAB_001255e3;
          memset(_is_second_flight + encoded_ch_inner.capacity,0,final_len);
          encoded_ch_inner.capacity = final_len + encoded_ch_inner.capacity;
        }
        uVar5 = (uint)decoded.bytes.len;
        emitter->buf->off = sVar1;
        local_1b8 = (encoded_ch_inner.capacity - 4) + ((tls->ech).aead)->algo->tag_size;
        ppVar2 = tls->ctx;
        sendbuf = emitter->buf;
        ppVar3 = (tls->field_19).client.key_share_ctx;
        sni_name_00 = (tls->ech).client.public_name;
        ech_size_offset = local_1b8;
        pVar12 = ptls_iovec_init((void *)0x0,0);
        psk_secret_01.len = (size_t)psk.secret.base;
        psk_secret_01.base = _auStack_78;
        psk_identity_01.len = (size_t)psk.identity.base;
        psk_identity_01.base = (uint8_t *)psk.secret.len;
        decoded.bytes.len._4_4_ =
             encode_client_hello(ppVar2,sendbuf,ENCODE_CH_MODE_OUTER,uVar5,properties,
                                 tls->client_random,ppVar3,sni_name_00,
                                 (tls->field_19).client.legacy_session_id,&tls->ech,&local_1b8,
                                 pVar12,psk_secret_01,psk_identity_01,sni_name._4_4_,
                                 (tls->key_schedule->hashes[0].algo)->digest_size,
                                 (ptls_iovec_t *)psk.label,
                                 (uint)((tls->field_19).server.pending_traffic_secret[0x38] >> 1 & 1
                                       ));
        if (decoded.bytes.len._4_4_ != 0) goto LAB_001255e3;
        ptls_aead_encrypt((tls->ech).aead,emitter->buf->base + local_1b8,_is_second_flight + 4,
                          encoded_ch_inner.capacity - 4,(long)(int)(uint)decoded.bytes.len,
                          emitter->buf->base + sVar1 + 4,emitter->buf->off - (sVar1 + 4));
        if ((uint)decoded.bytes.len == 0) {
          sVar8 = outer_ech_header_size((tls->ech).client.enc.len);
          __size = sVar8 + ech_size_offset;
          puVar9 = (uint8_t *)malloc(__size);
          sVar8 = local_1b8;
          (tls->ech).client.first_ech.base = puVar9;
          if (puVar9 == (uint8_t *)0x0) {
            decoded.bytes.len._4_4_ = 0x201;
            goto LAB_001255e3;
          }
          puVar9 = (tls->ech).client.first_ech.base;
          puVar4 = emitter->buf->base;
          sVar10 = outer_ech_header_size((tls->ech).client.enc.len);
          memcpy(puVar9,puVar4 + (sVar8 - sVar10),__size);
          (tls->ech).client.first_ech.len = __size;
          if ((properties->field_0).client.ech.configs.len == 0) {
            *(byte *)&tls->ech = *(byte *)&tls->ech & 0xfd | 2;
          }
          else {
            *(byte *)&tls->ech = *(byte *)&tls->ech & 0xfe | 1;
          }
        }
        ptls__key_schedule_update_hash
                  (tls->key_schedule,emitter->buf->base + sVar1,emitter->buf->off - sVar1,1);
      }
      decoded.bytes.len._4_4_ = (*emitter->commit_message)(emitter);
      if (decoded.bytes.len._4_4_ == 0) {
        if (((tls->field_19).server.pending_traffic_secret[0x38] >> 1 & 1) != 0) {
          if ((uint)decoded.bytes.len != 0) {
            __assert_fail("!is_second_flight",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                          ,0x9fb,
                          "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                         );
          }
          decoded.bytes.len._4_4_ = setup_traffic_protection(tls,1,"c e traffic",1,0,0);
          if ((decoded.bytes.len._4_4_ != 0) ||
             (decoded.bytes.len._4_4_ = push_change_cipher_spec(tls,emitter),
             decoded.bytes.len._4_4_ != 0)) goto LAB_001255e3;
        }
        decoded.bytes.len._4_4_ = 0;
        if ((_auStack_78 == (uint8_t *)0x0) ||
           (((uint)decoded.bytes.len != 0 ||
            (decoded.bytes.len._4_4_ = derive_exporter_secret(tls,1), decoded.bytes.len._4_4_ == 0))
           )) {
          eVar11 = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
          if (psk.label == (char *)0x0) {
            eVar11 = PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
          }
          tls->state = eVar11;
          decoded.bytes.len._4_4_ = 0x202;
        }
      }
    }
  }
LAB_001255e3:
  ptls_buffer_dispose((ptls_buffer_t *)&is_second_flight);
  (*ptls_clear_memory)(&encoded_ch_inner.is_allocated,0x40);
  return decoded.bytes.len._4_4_;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    struct {
        ptls_iovec_t secret;
        ptls_iovec_t identity;
        const char *label;
    } psk = {{NULL}};
    uint32_t obfuscated_ticket_age = 0;
    const char *sni_name = NULL;
    size_t mess_start, msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    ptls_buffer_t encoded_ch_inner;
    int ret, is_second_flight = tls->key_schedule != NULL;

    ptls_buffer_init(&encoded_ch_inner, "", 0);

    if (tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name))
        sni_name = tls->server_name;

    /* try to use ECH (ignore broken ECHConfigList; it is delivered insecurely) */
    if (properties != NULL) {
        if (!is_second_flight && sni_name != NULL && tls->ctx->ech.client.ciphers != NULL) {
            if (properties->client.ech.configs.len != 0) {
                struct st_decoded_ech_config_t decoded;
                client_decode_ech_config_list(tls->ctx, &decoded, properties->client.ech.configs);
                if (decoded.kem != NULL && decoded.cipher != NULL) {
                    if ((ret = client_setup_ech(&tls->ech, &decoded, tls->ctx->random_bytes)) != 0)
                        goto Exit;
                }
            } else {
                /* zero-length config indicates ECH greasing */
                client_setup_ech_grease(&tls->ech, tls->ctx->random_bytes, tls->ctx->ech.client.kems, tls->ctx->ech.client.ciphers,
                                        sni_name);
            }
        }
    }

    /* use external PSK if provided */
    if (tls->ctx->pre_shared_key.identity.base != NULL) {
        if (!is_second_flight) {
            tls->client.offered_psk = 1;
            for (size_t i = 0; tls->ctx->cipher_suites[i] != NULL; ++i) {
                if (tls->ctx->cipher_suites[i]->hash == tls->ctx->pre_shared_key.hash) {
                    tls->cipher_suite = tls->ctx->cipher_suites[i];
                    break;
                }
            }
            assert(tls->cipher_suite != NULL && "no compatible cipher-suite provided that matches psk.hash");
            if (properties != NULL && properties->client.max_early_data_size != NULL) {
                tls->client.using_early_data = 1;
                *properties->client.max_early_data_size = SIZE_MAX;
            }
        } else {
            assert(tls->cipher_suite != NULL && tls->cipher_suite->hash == tls->ctx->pre_shared_key.hash);
        }
        psk.secret = tls->ctx->pre_shared_key.secret;
        psk.identity = tls->ctx->pre_shared_key.identity;
        psk.label = "ext binder";
    }

    /* try to setup resumption-related data, unless external PSK is used */
    if (psk.secret.base == NULL && properties != NULL && properties->client.session_ticket.base != NULL &&
        tls->ctx->key_exchanges != NULL) {
        ptls_key_exchange_algorithm_t *key_share = NULL;
        ptls_cipher_suite_t *cipher_suite = NULL;
        uint32_t max_early_data_size;
        if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &psk.secret, &obfuscated_ticket_age, &psk.identity,
                                         &max_early_data_size, properties->client.session_ticket.base,
                                         properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
            psk.label = "res binder";
            tls->client.offered_psk = 1;
            /* key-share selected by HRR should not be overridden */
            if (tls->key_share == NULL)
                tls->key_share = key_share;
            tls->cipher_suite = cipher_suite;
            if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                tls->client.using_early_data = 1;
                *properties->client.max_early_data_size = max_early_data_size;
            }
        } else {
            psk.secret = ptls_iovec_init(NULL, 0);
        }
    }

    /* send 0-RTT related signals back to the client */
    if (properties != NULL) {
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && tls->ctx->key_exchanges != NULL &&
        !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    /* instantiate key share context */
    assert(tls->client.key_share_ctx == NULL);
    if (tls->key_share != NULL) {
        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
            goto Exit;
    }

    /* initialize key schedule */
    if (!is_second_flight) {
        if ((tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ech.aead != NULL)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if ((ret = key_schedule_extract(tls->key_schedule, psk.secret)) != 0)
            goto Exit;
    }

    /* start generating CH */
    if ((ret = emitter->begin_message(emitter)) != 0)
        goto Exit;
    mess_start = msghash_off = emitter->buf->off;

    /* generate true (inner) CH */
    if ((ret = encode_client_hello(tls->ctx, emitter->buf, ENCODE_CH_MODE_INNER, is_second_flight, properties,
                                   tls->ech.aead != NULL ? tls->ech.inner_client_random : tls->client_random,
                                   tls->client.key_share_ctx, sni_name, tls->client.legacy_session_id, &tls->ech, NULL,
                                   tls->ech.client.first_ech, psk.secret, psk.identity, obfuscated_ticket_age,
                                   tls->key_schedule->hashes[0].algo->digest_size, cookie, tls->client.using_early_data)) != 0)
        goto Exit;

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (psk.secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, psk.label)) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off, 0);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off, 0);

    /* ECH */
    if (tls->ech.aead != NULL) {
        /* build EncodedCHInner */
        if ((ret = encode_client_hello(tls->ctx, &encoded_ch_inner, ENCODE_CH_MODE_ENCODED_INNER, is_second_flight, properties,
                                       tls->ech.inner_client_random, tls->client.key_share_ctx, sni_name,
                                       tls->client.legacy_session_id, &tls->ech, NULL, ptls_iovec_init(NULL, 0), psk.secret,
                                       psk.identity, obfuscated_ticket_age, tls->key_schedule->hashes[0].algo->digest_size, cookie,
                                       tls->client.using_early_data)) != 0)
            goto Exit;
        if (psk.secret.base != NULL)
            memcpy(encoded_ch_inner.base + encoded_ch_inner.off - tls->key_schedule->hashes[0].algo->digest_size,
                   emitter->buf->base + emitter->buf->off - tls->key_schedule->hashes[0].algo->digest_size,
                   tls->key_schedule->hashes[0].algo->digest_size);
        { /* pad EncodedCHInner (following draft-ietf-tls-esni-15 6.1.3) */
            size_t padding_len;
            if (sni_name != NULL) {
                padding_len = strlen(sni_name);
                if (padding_len < tls->ech.client.max_name_length)
                    padding_len = tls->ech.client.max_name_length;
            } else {
                padding_len = tls->ech.client.max_name_length + 9;
            }
            size_t final_len = encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE + padding_len;
            final_len = (final_len + 31) / 32 * 32;
            padding_len = final_len - (encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE);
            if (padding_len != 0) {
                if ((ret = ptls_buffer_reserve(&encoded_ch_inner, padding_len)) != 0)
                    goto Exit;
                memset(encoded_ch_inner.base + encoded_ch_inner.off, 0, padding_len);
                encoded_ch_inner.off += padding_len;
            }
        }
        /* flush CHInner, build CHOuterAAD */
        emitter->buf->off = mess_start;
        size_t ech_payload_size = encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE + tls->ech.aead->algo->tag_size,
               ech_size_offset = ech_payload_size;
        if ((ret = encode_client_hello(tls->ctx, emitter->buf, ENCODE_CH_MODE_OUTER, is_second_flight, properties,
                                       tls->client_random, tls->client.key_share_ctx, tls->ech.client.public_name,
                                       tls->client.legacy_session_id, &tls->ech, &ech_size_offset, ptls_iovec_init(NULL, 0),
                                       psk.secret, psk.identity, obfuscated_ticket_age,
                                       tls->key_schedule->hashes[0].algo->digest_size, cookie, tls->client.using_early_data)) != 0)
            goto Exit;
        /* overwrite ECH payload */
        ptls_aead_encrypt(tls->ech.aead, emitter->buf->base + ech_size_offset, encoded_ch_inner.base + PTLS_HANDSHAKE_HEADER_SIZE,
                          encoded_ch_inner.off - PTLS_HANDSHAKE_HEADER_SIZE, is_second_flight,
                          emitter->buf->base + mess_start + PTLS_HANDSHAKE_HEADER_SIZE,
                          emitter->buf->off - (mess_start + PTLS_HANDSHAKE_HEADER_SIZE));
        /* keep the copy of the 1st ECH extension so that we can send it again in 2nd CH in response to rejection with HRR */
        if (!is_second_flight) {
            size_t len = outer_ech_header_size(tls->ech.client.enc.len) + ech_payload_size;
            if ((tls->ech.client.first_ech.base = malloc(len)) == NULL) {
                ret = PTLS_ERROR_NO_MEMORY;
                goto Exit;
            }
            memcpy(tls->ech.client.first_ech.base,
                   emitter->buf->base + ech_size_offset - outer_ech_header_size(tls->ech.client.enc.len), len);
            tls->ech.client.first_ech.len = len;
            if (properties->client.ech.configs.len != 0) {
                tls->ech.offered = 1;
            } else {
                tls->ech.offered_grease = 1;
            }
        }
        /* update hash */
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + mess_start, emitter->buf->off - mess_start, 1);
    }

    /* commit CH to the record layer */
    if ((ret = emitter->commit_message(emitter)) != 0)
        goto Exit;

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
            goto Exit;
    }
    if (psk.secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    ptls_buffer_dispose(&encoded_ch_inner);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}